

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualTest.cpp
# Opt level: O2

void __thiscall
oout::EqualTest::EqualTest(EqualTest *this,shared_ptr<const_oout::Text> *a,string *b)

{
  undefined8 uVar1;
  undefined1 auStack_38 [32];
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__EqualTest_001294f0;
  std::make_shared<oout::EqualMatch,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38);
  std::
  make_shared<oout::MatchTest,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::EqualMatch>>
            ((shared_ptr<const_oout::Text> *)(auStack_38 + 0x10),(shared_ptr<oout::EqualMatch> *)a);
  uVar1 = auStack_38._24_8_;
  auStack_38._24_8_ = 0;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_38._16_8_;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
  auStack_38._16_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  return;
}

Assistant:

EqualTest::EqualTest(const shared_ptr<const Text> &a, const string &b)
	: test(make_shared<MatchTest>(a, make_shared<EqualMatch>(b)))
{
}